

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O3

void uavs3d_if_hor_ver_luma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  byte bVar11;
  char cVar12;
  sbyte sVar13;
  long lVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  unkuint9 Var24;
  undefined1 auVar25 [11];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  uint uVar37;
  long lVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  uint uVar47;
  byte *pbVar48;
  uint uVar49;
  undefined1 *puVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [15];
  s16 tmp_res [17280];
  pel *local_8770;
  undefined1 local_8738 [34568];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 uVar60;
  
  sVar13 = (max_val != 0xff) * '\x02';
  cVar12 = (max_val == 0xff) * '\x02';
  pbVar48 = src + i_src * -3;
  if (max_val == 0xff) {
    if (height < -6) {
      return;
    }
    iVar41 = height + 3;
    if (iVar41 < -2) {
      iVar41 = -3;
    }
    puVar45 = local_8738;
    iVar33 = -3;
    do {
      if (0 < width) {
        uVar31 = *(ulong *)coeff_h;
        uVar60 = (undefined1)(uVar31 >> 0x38);
        auVar58._8_6_ = 0;
        auVar58._0_8_ = uVar31;
        auVar58[0xe] = uVar60;
        auVar58[0xf] = uVar60;
        uVar60 = (undefined1)(uVar31 >> 0x30);
        auVar57._14_2_ = auVar58._14_2_;
        auVar57._8_5_ = 0;
        auVar57._0_8_ = uVar31;
        auVar57[0xd] = uVar60;
        auVar56._13_3_ = auVar57._13_3_;
        auVar56._8_4_ = 0;
        auVar56._0_8_ = uVar31;
        auVar56[0xc] = uVar60;
        uVar60 = (undefined1)(uVar31 >> 0x28);
        auVar55._12_4_ = auVar56._12_4_;
        auVar55._8_3_ = 0;
        auVar55._0_8_ = uVar31;
        auVar55[0xb] = uVar60;
        auVar54._11_5_ = auVar55._11_5_;
        auVar54._8_2_ = 0;
        auVar54._0_8_ = uVar31;
        auVar54[10] = uVar60;
        uVar60 = (undefined1)(uVar31 >> 0x20);
        auVar53._10_6_ = auVar54._10_6_;
        auVar53[8] = 0;
        auVar53._0_8_ = uVar31;
        auVar53[9] = uVar60;
        auVar52._9_7_ = auVar53._9_7_;
        auVar52[8] = uVar60;
        auVar52._0_8_ = uVar31;
        uVar60 = (undefined1)(uVar31 >> 0x18);
        auVar59._8_8_ = auVar52._8_8_;
        auVar59[7] = uVar60;
        auVar59[6] = uVar60;
        uVar60 = (undefined1)(uVar31 >> 0x10);
        auVar59[5] = uVar60;
        auVar59[4] = uVar60;
        uVar60 = (undefined1)(uVar31 >> 8);
        auVar59[3] = uVar60;
        auVar59[2] = uVar60;
        auVar59[0] = (undefined1)uVar31;
        auVar59[1] = auVar59[0];
        auVar59 = psraw(auVar59,8);
        uVar34 = *(uint *)(pbVar48 + -3);
        uVar31 = 0;
        uVar29 = (uint)pbVar48[1];
        bVar2 = pbVar48[3];
        bVar11 = pbVar48[2];
        do {
          bVar1 = bVar2;
          bVar2 = pbVar48[uVar31 + 4];
          auVar17._4_4_ = uVar29;
          auVar17._0_4_ = uVar29;
          auVar17._8_7_ = 0;
          auVar61._8_7_ = 0;
          auVar61._0_8_ = (ulong)(uint)bVar11 << 0x28;
          auVar61 = ZEXT115(bVar2) << 0x38 |
                    (~DAT_00183ae0._0_15_ & ZEXT115(bVar1) << 0x30 |
                    (~DAT_00183ad0._0_15_ & auVar61 |
                    (~DAT_00183ac0._0_15_ & auVar17 | ZEXT415(uVar34) & DAT_00183ac0._0_15_) &
                    DAT_00183ad0._0_15_) & DAT_00183ae0._0_15_) & DAT_00183af0._0_15_;
          auVar15[0xd] = 0;
          auVar15._0_13_ = auVar61._0_13_;
          auVar15[0xe] = auVar61[7];
          auVar16[0xc] = auVar61[6];
          auVar16._0_12_ = auVar61._0_12_;
          auVar16._13_2_ = auVar15._13_2_;
          auVar18[0xb] = 0;
          auVar18._0_11_ = auVar61._0_11_;
          auVar18._12_3_ = auVar16._12_3_;
          auVar19[10] = auVar61[5];
          auVar19._0_10_ = auVar61._0_10_;
          auVar19._11_4_ = auVar18._11_4_;
          auVar20[9] = 0;
          auVar20._0_9_ = auVar61._0_9_;
          auVar20._10_5_ = auVar19._10_5_;
          auVar21[8] = auVar61[4];
          auVar21._0_8_ = auVar61._0_8_;
          auVar21._9_6_ = auVar20._9_6_;
          auVar23._7_8_ = 0;
          auVar23._0_7_ = auVar21._8_7_;
          Var24 = CONCAT81(SUB158(auVar23 << 0x40,7),auVar61[3]);
          auVar26._9_6_ = 0;
          auVar26._0_9_ = Var24;
          auVar25._1_10_ = SUB1510(auVar26 << 0x30,5);
          auVar25[0] = auVar61[2];
          auVar27._11_4_ = 0;
          auVar27._0_11_ = auVar25;
          auVar22[2] = auVar61[1];
          auVar22._0_2_ = auVar61._0_2_;
          auVar22._3_12_ = SUB1512(auVar27 << 0x20,3);
          *(ushort *)(puVar45 + uVar31 * 2) =
               (auVar15._13_2_ >> 8) * auVar59._14_2_ + (short)Var24 * auVar59._6_2_ +
               auVar19._10_2_ * auVar59._10_2_ + auVar22._2_2_ * auVar59._2_2_ +
               auVar16._12_2_ * auVar59._12_2_ + auVar25._0_2_ * auVar59._4_2_ +
               auVar21._8_2_ * auVar59._8_2_ + (auVar61._0_2_ & 0xff) * auVar59._0_2_;
          uVar31 = uVar31 + 1;
          uVar34 = uVar29 << 0x18 | uVar34 >> 8;
          uVar29 = (uint)bVar11;
          bVar11 = bVar1;
        } while ((uint)width != uVar31);
      }
      pbVar48 = pbVar48 + i_src;
      puVar45 = puVar45 + (long)width * 2;
      bVar51 = iVar33 != iVar41;
      iVar33 = iVar33 + 1;
    } while (bVar51);
  }
  else {
    if (height < -6) {
      return;
    }
    iVar41 = height + 3;
    if (iVar41 < -2) {
      iVar41 = -3;
    }
    puVar45 = local_8738;
    iVar33 = -3;
    do {
      if (0 < width) {
        cVar3 = *coeff_h;
        cVar4 = coeff_h[1];
        cVar5 = coeff_h[2];
        cVar6 = coeff_h[3];
        cVar7 = coeff_h[4];
        cVar8 = coeff_h[5];
        cVar9 = coeff_h[6];
        cVar10 = coeff_h[7];
        uVar31 = 0;
        uVar34 = (uint)pbVar48[-2];
        uVar29 = (uint)pbVar48[-3];
        uVar43 = (uint)pbVar48[1];
        uVar28 = (uint)pbVar48[3];
        uVar47 = (uint)pbVar48[-1];
        uVar49 = (uint)*pbVar48;
        uVar42 = (uint)pbVar48[2];
        do {
          uVar37 = uVar28;
          uVar32 = uVar43;
          uVar43 = uVar34;
          bVar11 = pbVar48[uVar31 + 4];
          *(short *)(puVar45 + uVar31 * 2) =
               (short)((int)((uint)bVar11 * (int)cVar10 +
                            uVar37 * (int)cVar9 +
                            uVar42 * (int)cVar8 + uVar32 * (int)cVar7 + uVar49 * (int)cVar6 +
                            uVar47 * (int)cVar5 + uVar43 * (int)cVar4 +
                            uVar29 * (int)cVar3 + ((uint)(1 << sVar13) >> 1)) >> sVar13);
          uVar31 = uVar31 + 1;
          uVar34 = uVar47;
          uVar29 = uVar43;
          uVar43 = uVar42;
          uVar28 = (uint)bVar11;
          uVar47 = uVar49;
          uVar49 = uVar32;
          uVar42 = uVar37;
        } while ((uint)width != uVar31);
      }
      pbVar48 = pbVar48 + i_src;
      puVar45 = puVar45 + (long)width * 2;
      bVar51 = iVar33 != iVar41;
      iVar33 = iVar33 + 1;
    } while (bVar51);
  }
  if (0 < height) {
    lVar30 = (long)(width * 3);
    puVar35 = local_8738 + lVar30 * 2;
    lVar38 = (long)width;
    lVar14 = lVar30 * 2;
    puVar50 = local_8738 + lVar14 + (long)(width * 4) * 2;
    puVar44 = local_8738 + lVar30 * 4;
    puVar46 = local_8738 + (long)(width * 2) * 2 + lVar30 * 2;
    lVar30 = lVar38 * 2;
    puVar40 = local_8738 + lVar14 + lVar38 * 2;
    puVar39 = local_8738 + lVar14 + lVar38 * -2;
    puVar36 = local_8738 + lVar14 + (long)(width * 2) * -2;
    iVar41 = 0;
    puVar45 = local_8738;
    local_8770 = dst;
    do {
      if (0 < width) {
        uVar31 = 0;
        do {
          iVar33 = (int)coeff_v[7] * (int)*(short *)(puVar50 + uVar31 * 2) +
                   (int)coeff_v[6] * (int)*(short *)(puVar44 + uVar31 * 2) +
                   (int)coeff_v[5] * (int)*(short *)(puVar46 + uVar31 * 2) +
                   (int)coeff_v[4] * (int)*(short *)(puVar40 + uVar31 * 2) +
                   (int)coeff_v[3] * (int)*(short *)(puVar35 + uVar31 * 2) +
                   (int)coeff_v[2] * (int)*(short *)(puVar39 + uVar31 * 2) +
                   (int)coeff_v[1] * (int)*(short *)(puVar36 + uVar31 * 2) +
                   (int)*coeff_v * (int)*(short *)(puVar45 + uVar31 * 2) + (1 << cVar12 + 9) >>
                   cVar12 + 10;
          if (max_val <= iVar33) {
            iVar33 = max_val;
          }
          if (iVar33 < 1) {
            iVar33 = 0;
          }
          local_8770[uVar31] = (pel)iVar33;
          uVar31 = uVar31 + 1;
        } while ((uint)width != uVar31);
      }
      local_8770 = local_8770 + i_dst;
      iVar41 = iVar41 + 1;
      puVar50 = puVar50 + lVar30;
      puVar44 = puVar44 + lVar30;
      puVar46 = puVar46 + lVar30;
      puVar40 = puVar40 + lVar30;
      puVar39 = puVar39 + lVar30;
      puVar36 = puVar36 + lVar30;
      puVar45 = puVar45 + lVar30;
      puVar35 = puVar35 + lVar30;
    } while (iVar41 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sum, val;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(128 + 7) * 128]);
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -3 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                sum = FLT_8TAP_HOR(src, col, coeff_h);
                tmp[col] = (sum + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                tmp[col] = FLT_8TAP_HOR(src, col, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 3 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(tmp, col, width, coeff_v);
            val = (sum + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        dst += i_dst;
        tmp += width;
    }
}